

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgTree.cpp
# Opt level: O3

void __thiscall dgRedBackNode::InsertFixup(dgRedBackNode *this,dgRedBackNode **head)

{
  undefined1 *puVar1;
  dgRedBackNode *pdVar2;
  dgRedBackNode *pdVar3;
  byte bVar4;
  dgRedBackNode *me;
  dgRedBackNode **ppdVar5;
  dgRedBackNode *pdVar6;
  dgRedBackNode *pdVar7;
  
  pdVar6 = *head;
  if (pdVar6 != this) {
    pdVar3 = this->m_parent;
    bVar4 = pdVar3->field_0x20;
    if ((bVar4 & 1) != 0) {
      ppdVar5 = &this->m_parent;
      do {
        pdVar7 = pdVar3->m_parent;
        pdVar6 = pdVar7->m_left;
        pdVar2 = pdVar7->m_right;
        if (pdVar3 == pdVar6) {
          if ((pdVar2 != (dgRedBackNode *)0x0) && ((pdVar2->field_0x20 & 1) != 0)) {
            pdVar3->field_0x20 = bVar4 & 0xfe;
            pdVar2->field_0x20 = pdVar2->field_0x20 & 0xfe;
            goto LAB_008543aa;
          }
          pdVar6 = pdVar3->m_right;
          if (this == pdVar6) {
            pdVar2 = pdVar6->m_left;
            pdVar3->m_right = pdVar2;
            if (pdVar2 == (dgRedBackNode *)0x0) {
              pdVar6->m_parent = pdVar7;
LAB_0085447d:
              ppdVar5 = &pdVar7->m_right;
              if (pdVar7->m_left == pdVar3) {
                ppdVar5 = &pdVar7->m_left;
              }
            }
            else {
              pdVar2->m_parent = pdVar3;
              pdVar7 = pdVar3->m_parent;
              pdVar6->m_parent = pdVar7;
              ppdVar5 = head;
              if (pdVar7 != (dgRedBackNode *)0x0) goto LAB_0085447d;
            }
            *ppdVar5 = pdVar6;
            pdVar6->m_left = pdVar3;
            pdVar3->m_parent = pdVar6;
            bVar4 = pdVar6->field_0x20;
            this = pdVar3;
            pdVar3 = pdVar6;
          }
          pdVar3->field_0x20 = bVar4 & 0xfe;
          pdVar6 = this->m_parent->m_parent;
          if (pdVar6 == (dgRedBackNode *)0x0) goto LAB_008544ff;
          puVar1 = &pdVar6->field_0x20;
          *puVar1 = *puVar1 | 1;
          pdVar6 = this->m_parent->m_parent;
          pdVar3 = pdVar6->m_left;
          pdVar2 = pdVar3->m_right;
          pdVar6->m_left = pdVar2;
          if (pdVar2 != (dgRedBackNode *)0x0) {
            pdVar2->m_parent = pdVar6;
          }
          pdVar2 = pdVar6->m_parent;
          pdVar3->m_parent = pdVar2;
          ppdVar5 = head;
          if (pdVar2 != (dgRedBackNode *)0x0) {
            ppdVar5 = &pdVar2->m_left;
            if (pdVar2->m_right == pdVar6) {
              ppdVar5 = &pdVar2->m_right;
            }
          }
          *ppdVar5 = pdVar3;
          pdVar3->m_right = pdVar6;
LAB_008544f8:
          pdVar6->m_parent = pdVar3;
        }
        else {
          if (pdVar3 != pdVar2) {
            __assert_fail("ptr->m_parent == ptr->m_parent->m_parent->m_right",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgTree.cpp"
                          ,0xa9,"void dgRedBackNode::InsertFixup(dgRedBackNode **const)");
          }
          if ((pdVar6 == (dgRedBackNode *)0x0) || ((pdVar6->field_0x20 & 1) == 0)) {
            pdVar6 = pdVar3->m_left;
            if (this == pdVar6) {
              pdVar2 = pdVar6->m_right;
              pdVar3->m_left = pdVar2;
              if (pdVar2 == (dgRedBackNode *)0x0) {
                pdVar6->m_parent = pdVar7;
LAB_008543f3:
                ppdVar5 = &pdVar7->m_left;
                if (pdVar7->m_right == pdVar3) {
                  ppdVar5 = &pdVar7->m_right;
                }
              }
              else {
                pdVar2->m_parent = pdVar3;
                pdVar7 = pdVar3->m_parent;
                pdVar6->m_parent = pdVar7;
                ppdVar5 = head;
                if (pdVar7 != (dgRedBackNode *)0x0) goto LAB_008543f3;
              }
              *ppdVar5 = pdVar6;
              pdVar6->m_right = pdVar3;
              pdVar3->m_parent = pdVar6;
              bVar4 = pdVar6->field_0x20;
              this = pdVar3;
              pdVar3 = pdVar6;
            }
            pdVar3->field_0x20 = bVar4 & 0xfe;
            pdVar6 = this->m_parent->m_parent;
            bVar4 = pdVar6->field_0x20;
            if ((bVar4 & 1) == 0) {
              pdVar6->field_0x20 = bVar4 | 1;
              pdVar6 = this->m_parent->m_parent;
              pdVar3 = pdVar6->m_right;
              pdVar2 = pdVar3->m_left;
              pdVar6->m_right = pdVar2;
              if (pdVar2 != (dgRedBackNode *)0x0) {
                pdVar2->m_parent = pdVar6;
              }
              pdVar2 = pdVar6->m_parent;
              pdVar3->m_parent = pdVar2;
              ppdVar5 = head;
              if (pdVar2 != (dgRedBackNode *)0x0) {
                ppdVar5 = &pdVar2->m_right;
                if (pdVar2->m_left == pdVar6) {
                  ppdVar5 = &pdVar2->m_left;
                }
              }
              *ppdVar5 = pdVar3;
              pdVar3->m_left = pdVar6;
              goto LAB_008544f8;
            }
          }
          else {
            pdVar3->field_0x20 = bVar4 & 0xfe;
            pdVar6->field_0x20 = pdVar6->field_0x20 & 0xfe;
LAB_008543aa:
            puVar1 = &(*ppdVar5)->m_parent->field_0x20;
            *puVar1 = *puVar1 | 1;
            this = (*ppdVar5)->m_parent;
          }
        }
LAB_008544ff:
        pdVar6 = *head;
        if (this == pdVar6) break;
        pdVar3 = this->m_parent;
        ppdVar5 = &this->m_parent;
        bVar4 = pdVar3->field_0x20;
      } while ((bVar4 & 1) != 0);
    }
  }
  pdVar6->field_0x20 = pdVar6->field_0x20 & 0xfe;
  return;
}

Assistant:

void dgRedBackNode::InsertFixup(dgRedBackNode ** const head) 
{
	dgRedBackNode* ptr = this;
	// check Red-Black properties 
	while ((ptr != *head) && (ptr->m_parent->GetColor() == RED)) {
		// we have a violation 
		if (ptr->m_parent == ptr->m_parent->m_parent->m_left) {
			dgRedBackNode* const tmp = ptr->m_parent->m_parent->m_right;
			if (tmp && (tmp->GetColor() == RED)) {
				// uncle is RED 
				ptr->m_parent->SetColor(BLACK);
				tmp->SetColor(BLACK) ;
				ptr->m_parent->m_parent->SetColor(RED) ;
				ptr = ptr->m_parent->m_parent;
			} else {
				// uncle is BLACK 
				if (ptr == ptr->m_parent->m_right) {
					// make ptr a left child 
					ptr = ptr->m_parent;
					ptr->RotateLeft(head);
				}

				ptr->m_parent->SetColor(BLACK);
				if (ptr->m_parent->m_parent) {
					ptr->m_parent->m_parent->SetColor(RED);
					ptr->m_parent->m_parent->RotateRight(head);
				}
			}
		} else {
			HACD_ASSERT (ptr->m_parent == ptr->m_parent->m_parent->m_right);
			// mirror image of above code 
			dgRedBackNode* const tmp = ptr->m_parent->m_parent->m_left;
			if (tmp && (tmp->GetColor() == RED)) {
				//uncle is RED 
				ptr->m_parent->SetColor(BLACK);
				tmp->SetColor(BLACK) ;
				ptr->m_parent->m_parent->SetColor(RED) ;
				ptr = ptr->m_parent->m_parent;
			} else {
				// uncle is BLACK 
				if (ptr == ptr->m_parent->m_left) {
					ptr = ptr->m_parent;
					ptr->RotateRight(head);
				}
				ptr->m_parent->SetColor(BLACK);
				if (ptr->m_parent->m_parent->GetColor() == BLACK) {
					ptr->m_parent->m_parent->SetColor(RED) ;
				   ptr->m_parent->m_parent->RotateLeft (head); 
				}
			}
		}
	}
	(*head)->SetColor(BLACK);
}